

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest_HorzSuperresQThreshEndToEndPSNRTest_Test>
::CreateTest(ParameterizedTestFactory<(anonymous_namespace)::HorzSuperresQThreshEndToEndTest_HorzSuperresQThreshEndToEndPSNRTest_Test>
             *this)

{
  _Tuple_impl<0UL,_int,_int> _Var1;
  GTestFlagSaver *pGVar2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  GTestFlagSaver *pGVar5;
  _func_int **pp_Var6;
  TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
  *this_00;
  ParamType *pPVar7;
  
  WithParamInterface<std::tuple<libaom_test::CodecFactory_const*,(anonymous_namespace)::TestVideoParam,std::tuple<int,int>>>
  ::parameter_ = &this->parameter_;
  this_00 = (TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
             *)operator_new(0x448);
  TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
  ::TestWithParam(this_00);
  pPVar7 = WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
           ::GetParam();
  this_00[1].super_Test.gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)
       (pPVar7->
       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
       ).super__Head_base<0UL,_const_libaom_test::CodecFactory_*,_false>._M_head_impl;
  *(undefined1 *)
   &this_00[1].
    super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
    ._vptr_WithParamInterface = 0;
  this_00[0x28].super_Test._vptr_Test =
       (_func_int **)
       &this_00[0x28].
        super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
  ;
  this_00[0x28].super_Test.gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  *(undefined1 *)
   &this_00[0x28].
    super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
    ._vptr_WithParamInterface = 0;
  *(undefined4 *)&this_00[0x2a].super_Test._vptr_Test = 0;
  this_00[0x29].super_Test.gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  this_00[0x29].
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
  ._vptr_WithParamInterface = (_func_int **)0x0;
  *(undefined4 *)((long)&this_00[2].super_Test._vptr_Test + 4) = 1;
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__HorzSuperresQThreshEndToEndTest_00f32960;
  (this_00->
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
  )._vptr_WithParamInterface = (_func_int **)&PTR__HorzSuperresQThreshEndToEndTest_00f329b8;
  this_00[1].super_Test._vptr_Test = (_func_int **)&PTR__HorzSuperresQThreshEndToEndTest_00f329d8;
  pPVar7 = WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
           ::GetParam();
  pGVar2 = (GTestFlagSaver *)
           (pPVar7->
           super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
           ).super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>.
           super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>_conflict._M_head_impl
           .filename;
  pp_Var3 = *(_func_int ***)
             &(pPVar7->
              super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
              ).super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
              .super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>_conflict.
              _M_head_impl.fmt;
  pp_Var4 = *(_func_int ***)
             &(pPVar7->
              super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
              ).super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
              .super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>_conflict.
              _M_head_impl.profile;
  pGVar5 = *(GTestFlagSaver **)
            &(pPVar7->
             super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
             ).super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>.
             super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>_conflict.
             _M_head_impl.screen_content;
  pp_Var6 = (_func_int **)
            (pPVar7->
            super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
            ).super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>.
            super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>_conflict.
            _M_head_impl.psnr_threshold2;
  this_00[0x2b].
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
  ._vptr_WithParamInterface =
       (_func_int **)
       (pPVar7->
       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
       ).super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>.
       super__Head_base<1UL,_(anonymous_namespace)::TestVideoParam,_false>_conflict._M_head_impl.
       psnr_threshold;
  this_00[0x2c].super_Test._vptr_Test = pp_Var6;
  this_00[0x2b].super_Test._vptr_Test = pp_Var4;
  this_00[0x2b].super_Test.gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl = pGVar5;
  this_00[0x2a].super_Test.gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl = pGVar2;
  this_00[0x2a].
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
  ._vptr_WithParamInterface = pp_Var3;
  *(undefined4 *)
   &this_00[0x2c].super_Test.gtest_flag_saver_._M_t.
    super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
    ._M_t.
    super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
    .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl = 3;
  this_00[0x2d].super_Test._vptr_Test = (_func_int **)0x0;
  *(undefined4 *)
   &this_00[0x2d].super_Test.gtest_flag_saver_._M_t.
    super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
    ._M_t.
    super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
    .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl = 0;
  pPVar7 = WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
           ::GetParam();
  _Var1 = (pPVar7->
          super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>
          ).super__Tuple_impl<1UL,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>.
          super__Tuple_impl<2UL,_std::tuple<int,_int>_>.
          super__Head_base<2UL,_std::tuple<int,_int>,_false>._M_head_impl.
          super__Tuple_impl<0UL,_int,_int>;
  *(ulong *)((long)&this_00[0x2c].super_Test.gtest_flag_saver_._M_t.
                    super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
                    .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false> + 4) =
       (ulong)_Var1 >> 0x20 | (long)_Var1 << 0x20;
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__HorzSuperresQThreshEndToEndTest_00f327f0;
  (this_00->
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_std::tuple<int,_int>_>_>
  )._vptr_WithParamInterface =
       (_func_int **)
       &PTR__HorzSuperresQThreshEndToEndTest_HorzSuperresQThreshEndToEndPSNRTest_Test_00f32848;
  this_00[1].super_Test._vptr_Test =
       (_func_int **)
       &PTR__HorzSuperresQThreshEndToEndTest_HorzSuperresQThreshEndToEndPSNRTest_Test_00f32868;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }